

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int flags)

{
  uint *workSpace_00;
  byte bVar1;
  BYTE *pBVar2;
  uint *count;
  uint uVar3;
  int iVar4;
  HUF_repeat HVar5;
  uint uVar6;
  uint *puVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  BYTE *oend;
  size_t _var_err__;
  BYTE *op;
  HUF_CElt *table;
  int iVar11;
  bool bVar12;
  HUF_CElt *CTable;
  uint maxSymbolValue_local;
  BYTE *local_68;
  BYTE *local_60;
  uint *local_58;
  ulong local_50;
  uint *local_48;
  BYTE *local_40;
  uint maxSymbolValueEnd;
  uint maxSymbolValueBegin;
  
  maxSymbolValue_local = maxSymbolValue;
  local_68 = (BYTE *)dst;
  local_60 = (BYTE *)src;
  puVar7 = (uint *)HUF_alignUpWorkspace(workSpace,&wkspSize,8);
  pBVar2 = local_60;
  if (wkspSize < 0x1f08) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  if (maxSymbolValue == 0) {
    maxSymbolValue_local = 0xff;
    maxSymbolValue = 0xff;
  }
  oend = local_68 + dstSize;
  uVar3 = 0xb;
  if (huffLog != 0) {
    uVar3 = huffLog;
  }
  bVar12 = (flags & 4U) == 0;
  iVar11 = flags;
  if ((repeat != (HUF_repeat *)0x0 && !bVar12) &&
     (op = local_68, CTable = oldHufTable, *repeat == HUF_repeat_valid)) goto LAB_0013d508;
  local_50 = CONCAT71(local_50._1_7_,repeat == (HUF_repeat *)0x0 || bVar12);
  local_48 = (uint *)CONCAT44(local_48._4_4_,uVar3);
  local_40 = oend;
  if (0x9fff < srcSize && (flags & 8U) != 0) {
    maxSymbolValueBegin = maxSymbolValue;
    uVar3 = HIST_count_simple(puVar7,&maxSymbolValueBegin,local_60,0x1000);
    iVar11 = flags;
    local_58 = (uint *)(ulong)uVar3;
    maxSymbolValueEnd = maxSymbolValue;
    uVar3 = HIST_count_simple(puVar7,&maxSymbolValueEnd,pBVar2 + (srcSize - 0x1000),0x1000);
    if ((ulong)uVar3 + (long)local_58 < 0x45) {
      return 0;
    }
  }
  workSpace_00 = puVar7 + 0x302;
  local_58 = puVar7;
  sVar8 = HIST_count_wksp(puVar7,&maxSymbolValue_local,local_60,srcSize,workSpace_00,0x1000);
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  if (sVar8 == srcSize) {
    *local_68 = *local_60;
    return 1;
  }
  if (sVar8 <= (srcSize >> 7) + 4) {
    return 0;
  }
  if (repeat != (HUF_repeat *)0x0) {
    HVar5 = *repeat;
    if (HVar5 == HUF_repeat_check) {
      iVar4 = HUF_validateCTable(oldHufTable,local_58,maxSymbolValue_local);
      if (iVar4 == 0) {
        *repeat = HUF_repeat_none;
        HVar5 = HUF_repeat_none;
        goto LAB_0013d647;
      }
      op = local_68;
      bVar1 = (byte)local_50;
    }
    else {
LAB_0013d647:
      bVar1 = (byte)local_50 | HVar5 == HUF_repeat_none;
      local_50 = CONCAT71(local_50._1_7_,bVar1);
      op = local_68;
    }
    oend = local_40;
    CTable = oldHufTable;
    local_68 = op;
    if (bVar1 == 0) goto LAB_0013d508;
  }
  count = local_58;
  uVar3 = maxSymbolValue_local;
  uVar9 = (ulong)maxSymbolValue_local;
  table = (HUF_CElt *)(puVar7 + 0x100);
  uVar6 = (uint)local_48;
  local_48 = workSpace_00;
  uVar6 = HUF_optimalTableLog(uVar6,srcSize,maxSymbolValue_local,workSpace_00,0x1300,table,local_58,
                              iVar11);
  puVar7 = local_48;
  local_50 = uVar9;
  sVar8 = HUF_buildCTable_wksp(table,count,uVar3,uVar6,local_48,0x1300);
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  uVar9 = (ulong)((int)local_50 + 2);
  memset(table + uVar9,0,uVar9 * -8 + 0x808);
  uVar3 = (uint)local_50;
  sVar8 = HUF_writeCTable_wksp(local_68,dstSize,table,uVar3,(uint)sVar8,puVar7,0x2ec);
  puVar7 = local_58;
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  if (repeat == (HUF_repeat *)0x0) {
    if (srcSize <= sVar8 + 0xc) {
      return 0;
    }
  }
  else {
    if (*repeat != HUF_repeat_none) {
      local_48 = (uint *)HUF_estimateCompressedSize(oldHufTable,local_58,uVar3);
      sVar10 = HUF_estimateCompressedSize(table,puVar7,uVar3);
      oend = local_40;
      op = local_68;
      CTable = oldHufTable;
      if ((srcSize <= sVar8 + 0xc) || (local_48 <= (uint *)(sVar10 + sVar8))) goto LAB_0013d508;
    }
    if (srcSize <= sVar8 + 0xc) {
      return 0;
    }
    *repeat = HUF_repeat_none;
  }
  op = local_68 + sVar8;
  oend = local_40;
  CTable = table;
  if (oldHufTable != (HUF_CElt *)0x0) {
    memcpy(oldHufTable,table,0x808);
    oend = local_40;
  }
LAB_0013d508:
  sVar8 = HUF_compressCTable_internal(local_68,op,oend,local_60,srcSize,nbStreams,CTable,iVar11);
  return sVar8;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int flags)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(size_t));
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    DEBUGLOG(5, "HUF_compress_internal (srcSize=%zu)", srcSize);
    HUF_STATIC_ASSERT(sizeof(*table) + HUF_WORKSPACE_MAX_ALIGNMENT <= HUF_WORKSPACE_SIZE);

    /* checks & inits */
    if (wkspSize < sizeof(*table)) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* If uncompressible data is suspected, do a smaller sampling first */
    DEBUG_STATIC_ASSERT(SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO >= 2);
    if ((flags & HUF_flags_suspectUncompressible) && srcSize >= (SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE * SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO)) {
        size_t largestTotal = 0;
        DEBUGLOG(5, "input suspected incompressible : sampling to check");
        {   unsigned maxSymbolValueBegin = maxSymbolValue;
            CHECK_V_F(largestBegin, HIST_count_simple (table->count, &maxSymbolValueBegin, (const BYTE*)src, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestBegin;
        }
        {   unsigned maxSymbolValueEnd = maxSymbolValue;
            CHECK_V_F(largestEnd, HIST_count_simple (table->count, &maxSymbolValueEnd, (const BYTE*)src + srcSize - SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestEnd;
        }
        if (largestTotal <= ((2 * SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, table->wksps.hist_wksp, sizeof(table->wksps.hist_wksp)) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }
    DEBUGLOG(6, "histogram detail completed (%zu symbols)", showU32(table->count, maxSymbolValue+1));

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue, &table->wksps, sizeof(table->wksps), table->CTable, table->count, flags);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            &table->wksps.buildCTable_wksp, sizeof(table->wksps.buildCTable_wksp));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        DEBUGLOG(6, "bit distribution completed (%zu symbols)", showCTableBits(table->CTable + 1, maxSymbolValue+1));
    }
    /* Zero unused symbols in CTable, so we can check it for validity */
    {
        size_t const ctableSize = HUF_CTABLE_SIZE_ST(maxSymbolValue);
        size_t const unusedSize = sizeof(table->CTable) - ctableSize * sizeof(HUF_CElt);
        ZSTD_memset(table->CTable + ctableSize, 0, unusedSize);
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable_wksp(op, dstSize, table->CTable, maxSymbolValue, huffLog,
                                              &table->wksps.writeCTable_wksp, sizeof(table->wksps.writeCTable_wksp)) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, flags);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            ZSTD_memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, flags);
}